

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::manual_tags_placement
          (NavierStokesBase *this,TagBoxArray *tags,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *bf_lev)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  int lev;
  int iVar5;
  Long LVar6;
  long lVar7;
  Box *pBVar8;
  IntVect *pIVar9;
  Box *in_RSI;
  long in_RDI;
  bool bVar10;
  IntVect IVar11;
  int dir_3;
  Box outflowBox_1;
  int rat;
  int j;
  int N_level_cells;
  int N_coarse_cells;
  int np;
  bool hasTags;
  Box outflowBox;
  int grid_tol;
  int mult;
  Box result;
  Box *crse_domain;
  int oDir;
  Orientation *outFace;
  int i;
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> outFaces;
  IndexType typ_1;
  int bg_1;
  uint bitval_1;
  int sm_1;
  int dir_2;
  IntVect hi_1;
  IntVect low_1;
  IndexType typ;
  int bg;
  uint bitval;
  int sm;
  int dir_1;
  IntVect hi;
  IntVect low;
  int dir;
  IntVect off;
  Box *in_stack_fffffffffffff978;
  int in_stack_fffffffffffff980;
  int in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  int iVar12;
  undefined4 in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  int iVar13;
  Box *in_stack_fffffffffffff998;
  int in_stack_fffffffffffff9ac;
  int in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  int in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  int local_640;
  int local_63c;
  int local_634;
  int local_630;
  int local_62c;
  int local_61c;
  int local_618;
  int local_614;
  int local_60c;
  int local_608;
  int local_604;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  Box *in_stack_fffffffffffffad0;
  TagBoxArray *in_stack_fffffffffffffad8;
  int local_504;
  Box local_4fc;
  int local_4e0 [3];
  undefined8 local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  TagVal in_stack_fffffffffffffb44;
  int in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  TagBoxArray *in_stack_fffffffffffffb50;
  Box local_440;
  undefined4 local_424;
  int local_420;
  Box local_41c;
  Box *local_400;
  int local_3f4;
  Orientation *local_3f0;
  int local_3e8;
  Box *local_3b8;
  IntVect *local_3a8;
  Box *local_3a0;
  uint local_394;
  uint local_390;
  int local_38c;
  int local_388 [3];
  undefined8 local_374;
  int local_36c;
  uint local_368;
  int local_364;
  int local_360;
  IntVect local_35c;
  IntVect local_350;
  int local_344;
  Box *local_340;
  Orientation local_338;
  uint local_334;
  uint local_330;
  int local_32c;
  int local_328 [3];
  undefined8 local_314;
  int local_30c;
  uint local_308;
  int local_304;
  uint local_300;
  IntVect local_2fc;
  IntVect local_2f0;
  int local_2e4;
  Box *local_2e0;
  Orientation local_2d8;
  int local_2d4;
  IntVect *local_2d0;
  int local_2c4;
  IntVect *local_2c0;
  int local_2b4;
  IntVect *local_2b0;
  int local_2a4;
  IntVect *local_2a0;
  int local_294;
  IntVect *local_290;
  int local_284;
  IntVect *local_280;
  uint local_274;
  IntVect *local_270;
  uint local_264;
  IntVect *local_260;
  uint local_254;
  undefined8 *local_250;
  int local_244;
  IntVect *local_240;
  int local_234;
  IntVect *local_230;
  int local_224;
  undefined8 *local_220;
  int local_214;
  undefined8 *local_210;
  int local_208;
  IntVect local_204;
  IntVect *local_1f8;
  Box *local_1f0;
  int local_1e4;
  IntVect *local_1e0;
  int local_1d4;
  IntVect *local_1d0;
  undefined4 local_1c4;
  IntVect *local_1c0;
  IntVect *local_1b8;
  IntVect *local_1b0;
  IntVect *local_1a8;
  IntVect *local_1a0;
  IntVect *local_198;
  Box *local_190;
  IndexType *local_188;
  int local_17c;
  IndexType *local_178;
  undefined4 local_170;
  int local_16c;
  IntVect *local_168;
  int local_160;
  uint local_15c;
  IntVect *local_158;
  int local_150;
  uint local_14c;
  IntVect *local_148;
  int local_140;
  uint local_13c;
  IntVect *local_138;
  int local_130;
  uint local_12c;
  IntVect *local_128;
  int local_120;
  int local_11c;
  IntVect *local_118;
  int local_110;
  int local_10c;
  IntVect *local_108;
  int local_100;
  int local_fc;
  IntVect *local_f8;
  int local_f0;
  int local_ec;
  IntVect *local_e8;
  IntVect *local_e0;
  IntVect *local_d8;
  undefined4 local_cc;
  IntVect *local_c8;
  undefined4 local_bc;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  IndexType *local_30;
  int local_28;
  uint local_24;
  uint *local_20;
  uint local_18;
  int local_14;
  uint *local_10;
  int local_4;
  
  local_3b8 = in_RSI;
  amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::Vector
            ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)0x5238b4);
  getOutFlowFaces((NavierStokesBase *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                  (Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                  CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  LVar6 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::size
                    ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)0x5238d8);
  if (0 < LVar6) {
    for (local_3e8 = 0; lVar7 = (long)local_3e8,
        LVar6 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::size
                          ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                           0x52390a), lVar7 < LVar6; local_3e8 = local_3e8 + 1) {
      local_3f0 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::operator[]
                            ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                             (size_type)in_stack_fffffffffffff978);
      local_3f4 = amrex::Orientation::coordDir(local_3f0);
      pBVar8 = amrex::Geometry::Domain((Geometry *)(in_RDI + 0x10));
      local_3a8 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                             (size_type)in_stack_fffffffffffff978);
      lVar7 = *(long *)(pBVar8->smallend).vect;
      lVar1 = *(long *)((pBVar8->smallend).vect + 2);
      lVar2 = *(long *)((pBVar8->bigend).vect + 1);
      local_41c.btype.itype = (pBVar8->btype).itype;
      local_1f0 = &local_41c;
      local_1c4 = 1;
      bVar10 = true;
      if ((local_3a8->vect[0] == 1) && (bVar10 = true, local_3a8->vect[1] == 1)) {
        bVar10 = local_3a8->vect[2] != 1;
      }
      local_41c.smallend.vect._0_8_ = lVar7;
      local_41c._8_8_ = lVar1;
      local_41c.bigend.vect._4_8_ = lVar2;
      local_3a0 = pBVar8;
      local_1f8 = local_3a8;
      local_1c0 = local_3a8;
      if (bVar10) {
        local_41c.smallend.vect[0] = (int)lVar7;
        local_84 = local_41c.smallend.vect[0];
        local_88 = local_3a8->vect[0];
        local_80 = local_84;
        if (local_88 != 1) {
          if (local_88 == 2) {
            if (local_41c.smallend.vect[0] < 0) {
              iVar4 = local_41c.smallend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5bc = -iVar4 / 2 + -1;
            }
            else {
              local_5bc = local_41c.smallend.vect[0] / 2;
            }
            local_80 = local_5bc;
          }
          else if (local_88 == 4) {
            if (local_41c.smallend.vect[0] < 0) {
              iVar4 = local_41c.smallend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5c0 = -iVar4 / 4 + -1;
            }
            else {
              local_5c0 = local_41c.smallend.vect[0] / 4;
            }
            local_80 = local_5c0;
          }
          else {
            if (local_41c.smallend.vect[0] < 0) {
              iVar4 = local_41c.smallend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5c4 = -iVar4 / local_88 + -1;
            }
            else {
              local_5c4 = local_41c.smallend.vect[0] / local_88;
            }
            local_80 = local_5c4;
          }
        }
        local_41c.smallend.vect[1] = (int)((ulong)lVar7 >> 0x20);
        local_90 = local_41c.smallend.vect[1];
        local_41c.smallend.vect[0] = local_80;
        local_94 = local_3a8->vect[1];
        local_8c = local_90;
        if (local_94 != 1) {
          if (local_94 == 2) {
            if (lVar7 < 0) {
              iVar4 = local_90 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5cc = -iVar4 / 2 + -1;
            }
            else {
              local_5cc = local_90 / 2;
            }
            local_8c = local_5cc;
          }
          else if (local_94 == 4) {
            if (lVar7 < 0) {
              iVar4 = local_90 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5d0 = -iVar4 / 4 + -1;
            }
            else {
              local_5d0 = local_90 / 4;
            }
            local_8c = local_5d0;
          }
          else {
            if (lVar7 < 0) {
              iVar4 = local_90 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5d4 = -iVar4 / local_94 + -1;
            }
            else {
              local_5d4 = local_90 / local_94;
            }
            local_8c = local_5d4;
          }
        }
        local_41c.smallend.vect[1] = local_8c;
        local_41c.smallend.vect[2] = (int)lVar1;
        local_9c = local_41c.smallend.vect[2];
        local_a0 = local_3a8->vect[2];
        local_98 = local_9c;
        if (local_a0 != 1) {
          if (local_a0 == 2) {
            if (local_41c.smallend.vect[2] < 0) {
              iVar4 = local_41c.smallend.vect[2] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5dc = -iVar4 / 2 + -1;
            }
            else {
              local_5dc = local_41c.smallend.vect[2] / 2;
            }
            local_98 = local_5dc;
          }
          else if (local_a0 == 4) {
            if (local_41c.smallend.vect[2] < 0) {
              iVar4 = local_41c.smallend.vect[2] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5e0 = -iVar4 / 4 + -1;
            }
            else {
              local_5e0 = local_41c.smallend.vect[2] / 4;
            }
            local_98 = local_5e0;
          }
          else {
            if (local_41c.smallend.vect[2] < 0) {
              iVar4 = local_41c.smallend.vect[2] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_5e4 = -iVar4 / local_a0 + -1;
            }
            else {
              local_5e4 = local_41c.smallend.vect[2] / local_a0;
            }
            local_98 = local_5e4;
          }
        }
        local_41c.bigend.vect[0] = (int)((ulong)lVar1 >> 0x20);
        local_634 = local_41c.bigend.vect[0];
        local_41c.smallend.vect[2] = local_98;
        local_188 = &local_41c.btype;
        local_198 = local_3a8;
        local_190 = local_1f0;
        if (local_41c.btype.itype == 0) {
          local_1a0 = &local_41c.bigend;
          local_60 = local_634;
          local_64 = local_3a8->vect[0];
          local_5c = local_60;
          if (local_64 != 1) {
            if (local_64 == 2) {
              if (lVar1 < 0) {
                local_634 = local_634 + 1;
                if (local_634 < 1) {
                  local_634 = -local_634;
                }
                local_62c = -local_634 / 2 + -1;
              }
              else {
                local_62c = local_634 / 2;
              }
              local_5c = local_62c;
            }
            else if (local_64 == 4) {
              if (lVar1 < 0) {
                local_634 = local_634 + 1;
                if (local_634 < 1) {
                  local_634 = -local_634;
                }
                local_630 = -local_634 / 4 + -1;
              }
              else {
                local_630 = local_634 / 4;
              }
              local_5c = local_630;
            }
            else {
              if (lVar1 < 0) {
                local_634 = local_634 + 1;
                if (local_634 < 1) {
                  local_634 = -local_634;
                }
                local_634 = -local_634 / local_64 + -1;
              }
              else {
                local_634 = local_634 / local_64;
              }
              local_5c = local_634;
            }
          }
          local_41c.bigend.vect[0] = local_5c;
          local_41c.bigend.vect[1] = (int)lVar2;
          local_6c = local_41c.bigend.vect[1];
          local_70 = local_3a8->vect[1];
          local_68 = local_6c;
          if (local_70 != 1) {
            if (local_70 == 2) {
              if (local_41c.bigend.vect[1] < 0) {
                iVar4 = local_41c.bigend.vect[1] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_63c = -iVar4 / 2 + -1;
              }
              else {
                local_63c = local_41c.bigend.vect[1] / 2;
              }
              local_68 = local_63c;
            }
            else if (local_70 == 4) {
              if (local_41c.bigend.vect[1] < 0) {
                iVar4 = local_41c.bigend.vect[1] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_640 = -iVar4 / 4 + -1;
              }
              else {
                local_640 = local_41c.bigend.vect[1] / 4;
              }
              local_68 = local_640;
            }
            else if (local_41c.bigend.vect[1] < 0) {
              iVar4 = local_41c.bigend.vect[1] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffff9bc = -iVar4 / local_70 + -1;
              local_68 = in_stack_fffffffffffff9bc;
            }
            else {
              in_stack_fffffffffffff9bc = local_41c.bigend.vect[1] / local_70;
              local_68 = in_stack_fffffffffffff9bc;
            }
          }
          local_41c.bigend.vect[2] = (int)((ulong)lVar2 >> 0x20);
          local_78 = local_41c.bigend.vect[2];
          local_41c.bigend.vect[1] = local_68;
          in_stack_fffffffffffff9b8 = local_3a8->vect[2];
          local_74 = local_78;
          if (in_stack_fffffffffffff9b8 != 1) {
            if (in_stack_fffffffffffff9b8 == 2) {
              if (lVar2 < 0) {
                iVar4 = local_78 + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                in_stack_fffffffffffff9b4 = -iVar4 / 2 + -1;
                local_74 = in_stack_fffffffffffff9b4;
              }
              else {
                in_stack_fffffffffffff9b4 = local_78 / 2;
                local_74 = in_stack_fffffffffffff9b4;
              }
            }
            else if (in_stack_fffffffffffff9b8 == 4) {
              if (lVar2 < 0) {
                iVar4 = local_78 + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                in_stack_fffffffffffff9b0 = -iVar4 / 4 + -1;
                local_74 = in_stack_fffffffffffff9b0;
              }
              else {
                in_stack_fffffffffffff9b0 = local_78 / 4;
                local_74 = in_stack_fffffffffffff9b0;
              }
            }
            else if (lVar2 < 0) {
              iVar4 = local_78 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffff9ac = -iVar4 / in_stack_fffffffffffff9b8 + -1;
              local_74 = in_stack_fffffffffffff9ac;
            }
            else {
              in_stack_fffffffffffff9ac = local_78 / in_stack_fffffffffffff9b8;
              local_74 = in_stack_fffffffffffff9ac;
            }
          }
          local_41c.bigend.vect[2] = local_74;
          local_41c._8_8_ = local_41c._8_8_;
          local_41c.bigend.vect._4_8_ = local_41c.bigend.vect._4_8_;
          local_1a8 = local_3a8;
          local_7c = in_stack_fffffffffffff9b8;
        }
        else {
          amrex::IntVect::IntVect(&local_204,0);
          uVar3 = local_41c.bigend.vect._4_8_;
          for (local_208 = 0; local_208 < 3; local_208 = local_208 + 1) {
            local_178 = &local_41c.btype;
            local_17c = local_208;
            local_34 = local_208;
            local_28 = local_208;
            if ((local_41c.btype.itype & 1 << ((byte)local_208 & 0x1f)) != 0) {
              local_1d0 = &local_41c.bigend;
              local_1d4 = local_208;
              local_1e0 = local_1f8;
              local_1e4 = local_208;
              if (local_1d0->vect[local_208] % local_1f8->vect[local_208] != 0) {
                local_168 = &local_204;
                local_16c = local_208;
                local_170 = 1;
                local_168->vect[local_208] = 1;
              }
            }
            local_30 = local_178;
          }
          local_1b0 = &local_41c.bigend;
          local_1b8 = local_1f8;
          local_3c = local_41c.bigend.vect[0];
          local_40 = local_1f8->vect[0];
          local_38 = local_3c;
          if (local_40 != 1) {
            if (local_40 == 2) {
              if ((long)local_41c._8_8_ < 0) {
                iVar4 = local_41c.bigend.vect[0] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_5f4 = -iVar4 / 2 + -1;
              }
              else {
                local_5f4 = local_41c.bigend.vect[0] / 2;
              }
              local_38 = local_5f4;
            }
            else if (local_40 == 4) {
              if ((long)local_41c._8_8_ < 0) {
                iVar4 = local_41c.bigend.vect[0] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_5f8 = -iVar4 / 4 + -1;
              }
              else {
                local_5f8 = local_41c.bigend.vect[0] / 4;
              }
              local_38 = local_5f8;
            }
            else {
              if ((long)local_41c._8_8_ < 0) {
                iVar4 = local_41c.bigend.vect[0] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_5fc = -iVar4 / local_40 + -1;
              }
              else {
                local_5fc = local_41c.bigend.vect[0] / local_40;
              }
              local_38 = local_5fc;
            }
          }
          local_41c.bigend.vect[0] = local_38;
          local_48 = local_41c.bigend.vect[1];
          local_4c = local_1f8->vect[1];
          local_44 = local_48;
          if (local_4c != 1) {
            if (local_4c == 2) {
              if (local_41c.bigend.vect[1] < 0) {
                iVar4 = local_41c.bigend.vect[1] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_604 = -iVar4 / 2 + -1;
              }
              else {
                local_604 = local_41c.bigend.vect[1] / 2;
              }
              local_44 = local_604;
            }
            else if (local_4c == 4) {
              if (local_41c.bigend.vect[1] < 0) {
                iVar4 = local_41c.bigend.vect[1] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_608 = -iVar4 / 4 + -1;
              }
              else {
                local_608 = local_41c.bigend.vect[1] / 4;
              }
              local_44 = local_608;
            }
            else {
              if (local_41c.bigend.vect[1] < 0) {
                iVar4 = local_41c.bigend.vect[1] + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_60c = -iVar4 / local_4c + -1;
              }
              else {
                local_60c = local_41c.bigend.vect[1] / local_4c;
              }
              local_44 = local_60c;
            }
          }
          local_54 = local_41c.bigend.vect[2];
          local_41c.bigend.vect[1] = local_44;
          local_58 = local_1f8->vect[2];
          local_50 = local_54;
          if (local_58 != 1) {
            if (local_58 == 2) {
              if ((long)uVar3 < 0) {
                iVar4 = local_54 + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_614 = -iVar4 / 2 + -1;
              }
              else {
                local_614 = local_54 / 2;
              }
              local_50 = local_614;
            }
            else if (local_58 == 4) {
              if ((long)uVar3 < 0) {
                iVar4 = local_54 + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_618 = -iVar4 / 4 + -1;
              }
              else {
                local_618 = local_54 / 4;
              }
              local_50 = local_618;
            }
            else {
              if ((long)uVar3 < 0) {
                iVar4 = local_54 + 1;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                local_61c = -iVar4 / local_58 + -1;
              }
              else {
                local_61c = local_54 / local_58;
              }
              local_50 = local_61c;
            }
          }
          local_41c.bigend.vect[2] = local_50;
          local_d8 = &local_41c.bigend;
          local_e0 = &local_204;
          local_ac = 0;
          local_41c.bigend.vect[0] = local_204.vect[0] + local_41c.bigend.vect[0];
          local_bc = 1;
          iVar4 = local_41c.bigend.vect[2];
          local_41c.bigend.vect[1] = local_204.vect[1] + local_41c.bigend.vect[1];
          local_cc = 2;
          local_41c.bigend.vect[2] = local_204.vect[2] + iVar4;
          local_41c._8_8_ = local_41c._8_8_;
          local_41c.bigend.vect._4_8_ = local_41c.bigend.vect._4_8_;
          local_c8 = local_e0;
          local_b8 = local_e0;
          local_a8 = local_e0;
        }
      }
      local_400 = &local_41c;
      bVar10 = amrex::Orientation::isLow(local_3f0);
      local_420 = -1;
      if (bVar10) {
        local_420 = 1;
      }
      if (do_refine_outflow == 0) {
        if (do_derefine_outflow != 0) {
          in_stack_fffffffffffffb4c = amrex::AmrMesh::nProper(*(AmrMesh **)(in_RDI + 0x150));
          iVar4 = Nbuf_outflow;
          local_280 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                 (size_type)in_stack_fffffffffffff978);
          local_284 = local_3f4;
          lev = iVar4 / local_280->vect[local_3f4];
          iVar13 = Nbuf_outflow;
          local_290 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                 (size_type)in_stack_fffffffffffff978);
          local_294 = local_3f4;
          if (iVar13 % local_290->vect[local_3f4] != 0) {
            lev = lev + 1;
          }
          in_stack_fffffffffffffb48 = lev;
          local_2a0 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                 (size_type)in_stack_fffffffffffff978);
          local_2a4 = local_3f4;
          in_stack_fffffffffffffb44 = lev * local_2a0->vect[local_3f4];
          for (local_4c0 = 1; local_4c0 <= *(int *)(in_RDI + 8); local_4c0 = local_4c0 + 1) {
            IVar11 = amrex::AmrMesh::refRatio((AmrMesh *)CONCAT44(iVar13,iVar4),lev);
            local_4e0._0_8_ = IVar11.vect._0_8_;
            local_4d0._0_4_ = local_4e0[0];
            local_4d0._4_4_ = local_4e0[1];
            local_4e0[2] = IVar11.vect[2];
            local_4c8 = local_4e0[2];
            local_210 = &local_4d0;
            local_214 = local_3f4;
            local_4c4 = *(int *)((long)local_210 + (long)local_3f4 * 4);
            in_stack_fffffffffffff984 =
                 in_stack_fffffffffffffb44 * local_4c4 + in_stack_fffffffffffffb4c;
            local_4e0 = IVar11.vect;
            iVar12 = in_stack_fffffffffffff984;
            local_2b0 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                   CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                   (size_type)in_stack_fffffffffffff978);
            local_2b4 = local_3f4;
            iVar5 = in_stack_fffffffffffff984 / local_2b0->vect[local_3f4];
            local_2c0 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                   CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                   (size_type)in_stack_fffffffffffff978);
            local_2c4 = local_3f4;
            in_stack_fffffffffffff980 = iVar5;
            if (iVar12 % local_2c0->vect[local_3f4] != 0) {
              in_stack_fffffffffffff980 = iVar5 + 1;
            }
            in_stack_fffffffffffffb48 = in_stack_fffffffffffff980;
            local_2d0 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                   CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                   (size_type)in_stack_fffffffffffff978);
            local_2d4 = local_3f4;
            in_stack_fffffffffffffb44 = in_stack_fffffffffffff980 * local_2d0->vect[local_3f4];
          }
          if (0 < in_stack_fffffffffffffb48) {
            local_338.val = local_3f0->val;
            local_340 = local_400;
            local_344 = 1;
            pIVar9 = amrex::Box::smallEnd(local_400);
            local_350.vect._0_8_ = *(undefined8 *)pIVar9->vect;
            local_350.vect[2] = pIVar9->vect[2];
            pIVar9 = amrex::Box::bigEnd(local_340);
            local_35c.vect._0_8_ = *(undefined8 *)pIVar9->vect;
            local_35c.vect[2] = pIVar9->vect[2];
            local_360 = amrex::Orientation::coordDir(&local_338);
            bVar10 = amrex::Orientation::isLow(&local_338);
            if (bVar10) {
              local_244 = local_360;
              local_364 = local_350.vect[local_360];
              local_10c = local_360;
              local_350.vect[local_360] = local_364 - local_344;
              local_11c = local_360;
              local_35c.vect[local_360] = local_364 + -1;
              local_240 = &local_350;
              local_120 = local_364 + -1;
              local_118 = &local_35c;
              local_110 = local_364 - local_344;
              local_108 = &local_350;
            }
            else {
              IVar11 = amrex::Box::type(in_stack_fffffffffffff998);
              local_388._0_8_ = IVar11.vect._0_8_;
              local_374._0_4_ = local_388[0];
              local_374._4_4_ = local_388[1];
              local_388[2] = IVar11.vect[2];
              local_36c = local_388[2];
              local_224 = local_360;
              local_368 = *(uint *)((long)&local_374 + (long)local_360 * 4);
              local_234 = local_360;
              local_38c = (local_35c.vect[local_360] + 1) - (local_368 & 1);
              local_ec = local_360;
              local_350.vect[local_360] = local_38c;
              iVar4 = local_38c + local_344 + -1;
              local_fc = local_360;
              local_35c.vect[local_360] = iVar4;
              local_388 = IVar11.vect;
              local_230 = &local_35c;
              local_220 = &local_374;
              local_100 = iVar4;
              local_f8 = &local_35c;
              local_f0 = local_38c;
              local_e8 = &local_350;
            }
            local_394 = (uint)amrex::Box::ixType(local_340);
            local_10 = &local_390;
            local_14 = local_360;
            local_4 = local_360;
            local_394 = (1 << ((byte)local_360 & 0x1f) ^ 0xffffffffU) & local_394;
            local_390 = local_394;
            amrex::Box::Box(&local_4fc,&local_350,&local_35c,(IndexType)local_394);
            for (local_504 = 0; local_504 < 3; local_504 = local_504 + 1) {
              if (local_504 != local_3f4) {
                amrex::Box::grow(&local_4fc,local_504,1);
              }
            }
            bVar10 = amrex::Orientation::isLow(local_3f0);
            if (bVar10) {
              amrex::Box::growHi(&local_4fc,local_3f4,in_stack_fffffffffffffb48);
            }
            else {
              amrex::Box::growLo(&local_4fc,local_3f4,in_stack_fffffffffffffb48);
            }
            in_stack_fffffffffffff978 = local_3b8;
            amrex::BoxArray::BoxArray
                      ((BoxArray *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                       (Box *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                       in_stack_fffffffffffff9ac);
            amrex::TagBoxArray::setVal
                      (in_stack_fffffffffffffb50,
                       (BoxArray *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                       in_stack_fffffffffffffb44);
            amrex::BoxArray::~BoxArray
                      ((BoxArray *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          }
        }
      }
      else {
        local_424 = 1;
        local_2d8.val = local_3f0->val;
        local_2e0 = local_400;
        local_2e4 = 1;
        pIVar9 = amrex::Box::smallEnd(local_400);
        local_2f0.vect._0_8_ = *(undefined8 *)pIVar9->vect;
        local_2f0.vect[2] = pIVar9->vect[2];
        pIVar9 = amrex::Box::bigEnd(local_2e0);
        local_2fc.vect._0_8_ = *(undefined8 *)pIVar9->vect;
        local_2fc.vect[2] = pIVar9->vect[2];
        local_300 = amrex::Orientation::coordDir(&local_2d8);
        bVar10 = amrex::Orientation::isLow(&local_2d8);
        if (bVar10) {
          local_274 = local_300;
          local_304 = local_2f0.vect[(int)local_300];
          local_14c = local_300;
          local_2f0.vect[(int)local_300] = local_304 - local_2e4;
          local_15c = local_300;
          local_2fc.vect[(int)local_300] = local_304 + -1;
          local_270 = &local_2f0;
          local_160 = local_304 + -1;
          local_158 = &local_2fc;
          local_150 = local_304 - local_2e4;
          local_148 = &local_2f0;
        }
        else {
          IVar11 = amrex::Box::type(in_stack_fffffffffffff998);
          local_328._0_8_ = IVar11.vect._0_8_;
          local_314._0_4_ = local_328[0];
          local_314._4_4_ = local_328[1];
          local_328[2] = IVar11.vect[2];
          local_30c = local_328[2];
          local_254 = local_300;
          local_308 = *(uint *)((long)&local_314 + (long)(int)local_300 * 4);
          local_264 = local_300;
          local_32c = (local_2fc.vect[(int)local_300] + 1) - (local_308 & 1);
          local_12c = local_300;
          local_2f0.vect[(int)local_300] = local_32c;
          iVar4 = local_32c + local_2e4 + -1;
          local_13c = local_300;
          local_2fc.vect[(int)local_300] = iVar4;
          local_328 = IVar11.vect;
          local_260 = &local_2fc;
          local_250 = &local_314;
          local_140 = iVar4;
          local_138 = &local_2fc;
          local_130 = local_32c;
          local_128 = &local_2f0;
        }
        local_334 = (uint)amrex::Box::ixType(local_2e0);
        local_20 = &local_330;
        local_24 = local_300;
        local_18 = local_300;
        local_334 = local_334 & ~(1 << (local_300 & 0x1f));
        local_330 = local_334;
        amrex::Box::Box(&local_440,&local_2f0,&local_2fc,(IndexType)local_334);
        amrex::Box::shift(&local_440,local_3f4,local_420);
        bVar10 = amrex::TagBoxArray::hasTags(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        if (bVar10) {
          in_stack_fffffffffffff998 = local_3b8;
          amrex::BoxArray::BoxArray
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                     (Box *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                     in_stack_fffffffffffff9ac);
          amrex::TagBoxArray::setVal
                    (in_stack_fffffffffffffb50,
                     (BoxArray *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                     in_stack_fffffffffffffb44);
          amrex::BoxArray::~BoxArray
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        }
      }
    }
  }
  amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::~Vector
            ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)0x5256a5);
  return;
}

Assistant:

void
NavierStokesBase::manual_tags_placement (TagBoxArray&    tags,
                                         const Vector<IntVect>& bf_lev)
{
    Vector<Orientation> outFaces;
    getOutFlowFaces(outFaces);
    if (outFaces.size()>0)
    {
        for (int i=0; i<outFaces.size(); ++i)
        {
            const Orientation& outFace = outFaces[i];
            const int oDir = outFace.coordDir();
            const Box& crse_domain = amrex::coarsen(geom.Domain(),bf_lev[level]);
            const int mult = (outFace.isLow() ? +1 : -1);
            if (do_refine_outflow)
            {
                //
                // Refine entire outflow boundary if new boxes within grid_tol
                // from outflow
                //
                const int grid_tol = 1;

                Box outflowBox = amrex::adjCell(crse_domain,outFace,grid_tol);

                outflowBox.shift(oDir,mult*grid_tol);

                //
                // Only refine if there are already tagged cells in the outflow
                // region
                //
                bool hasTags = tags.hasTags(outflowBox);
                if (hasTags)
                    tags.setVal(BoxArray(&outflowBox,1),TagBox::SET);
                }
            else if (do_derefine_outflow)
            {
                const int np = parent->nProper();
                //
                // Calculate the number of level 0 cells to be left uncovered
                // at the outflow.  The convoluted logic allows for the fact that
                // the number of uncovered cells must be a multiple of the level
                // blocking factor.  So, when calculating the number of coarse
                // cells below, we always round the division up.
                //
                int N_coarse_cells = Nbuf_outflow / bf_lev[0][oDir];
                if (Nbuf_outflow % bf_lev[0][oDir] != 0)
                    N_coarse_cells++;

                int N_level_cells = N_coarse_cells * bf_lev[0][oDir];

                //
                // Adjust this to get the number of cells to be left uncovered at
                // levels higher than 0
                //
                for (int j = 1; j <= level; ++j)
                {
                    /*** Calculate the minimum cells at this level ***/

                    const int rat = (parent->refRatio(j-1))[oDir];
                    N_level_cells = N_level_cells * rat + np;

                    /*** Calculate the required number of coarse cells ***/

                    N_coarse_cells = N_level_cells / bf_lev[j][oDir];
                    if (N_level_cells % bf_lev[j][oDir] != 0)
                        N_coarse_cells++;

                    /*** Calculate the corresponding number of level cells ***/

                    N_level_cells = N_coarse_cells * bf_lev[j][oDir];
                }
                //
                // Untag the cells near the outflow
                //
                if (N_coarse_cells > 0)
                {
                    //
                    // Generate box at the outflow and grow it in all directions
                    // other than the outflow.  This forces outflow cells in the
                    // ghostcells in directions other that oDir to be cleared.
                    //
                    Box outflowBox = amrex::adjCell(crse_domain, outFace, 1);
                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        if (dir != oDir) outflowBox.grow(dir, 1);
                    //
                    // Now, grow the box into the domain (opposite direction as
                    // outFace) the number of cells we need to clear.
                    //
                    if (outFace.isLow())
                        outflowBox.growHi(oDir, N_coarse_cells);
                    else
                        outflowBox.growLo(oDir, N_coarse_cells);

                    tags.setVal(BoxArray(&outflowBox,1),TagBox::CLEAR);
                }
            }
        }
    }
}